

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void printJsonResult(Statement *query,ostream *stream,bool isFirstRow)

{
  int32_t iVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  undefined7 in_register_00000011;
  double dVar4;
  Column local_c0;
  Column local_a8;
  Column local_90;
  Column local_78;
  Column local_60;
  Column local_48;
  Column local_30;
  
  if ((int)CONCAT71(in_register_00000011,isFirstRow) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,",",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
    std::ostream::put((char)stream);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{\"timestamp\":\"",0xe);
  SQLite::Statement::getColumn(&local_30,query,0);
  __s = SQLite::Column::getText(&local_30,"");
  if (__s == (char *)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\",",2);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\"temp1\":",8);
  SQLite::Statement::getColumn(&local_48,query,1);
  dVar4 = SQLite::Column::getDouble(&local_48);
  poVar3 = std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"temp2\":",8);
  SQLite::Statement::getColumn(&local_60,query,2);
  dVar4 = SQLite::Column::getDouble(&local_60);
  poVar3 = std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"temp3\":",8);
  SQLite::Statement::getColumn(&local_78,query,3);
  dVar4 = SQLite::Column::getDouble(&local_78);
  poVar3 = std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"temp4\":",8);
  SQLite::Statement::getColumn(&local_90,query,4);
  dVar4 = SQLite::Column::getDouble(&local_90);
  poVar3 = std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"valve1\":",9);
  SQLite::Statement::getColumn(&local_a8,query,5);
  iVar1 = SQLite::Column::getInt(&local_a8);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"valve2\":",9);
  SQLite::Statement::getColumn(&local_c0,query,6);
  iVar1 = SQLite::Column::getInt(&local_c0);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  if (local_c0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_90.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_60.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_48.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_30.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void printJsonResult(SQLite::Statement& query, std::ostream& stream, bool isFirstRow)
{
    if (!isFirstRow) {
        stream << "," << std::endl;
    }

    stream << "{\"timestamp\":\"" << query.getColumn(0).getText()   << "\","
           << "\"temp1\":"        << query.getColumn(1).getDouble() << ","
           << "\"temp2\":"        << query.getColumn(2).getDouble() << ","
           << "\"temp3\":"        << query.getColumn(3).getDouble() << ","
           << "\"temp4\":"        << query.getColumn(4).getDouble() << ","
           << "\"valve1\":"       << query.getColumn(5).getInt()    << ","
           << "\"valve2\":"       << query.getColumn(6).getInt()    << "}";
}